

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O0

void __thiscall AsyncLogging::threadFunc(AsyncLogging *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  FixedBuffer<4000000> *this_00;
  element_type *peVar4;
  size_type sVar5;
  __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  char *logline;
  reference __r;
  size_t __n;
  shared_ptr<FixedBuffer<4000000>_> *buffer;
  iterator __end2;
  iterator __begin2;
  BufferVector *__range2;
  __normal_iterator<std::shared_ptr<FixedBuffer<4000000>_>_*,_std::vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>_>
  local_b0;
  const_iterator local_a8;
  __normal_iterator<std::shared_ptr<FixedBuffer<4000000>_>_*,_std::vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>_>
  local_a0;
  __normal_iterator<std::shared_ptr<FixedBuffer<4000000>_>_*,_std::vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>_>
  local_98;
  const_iterator local_90;
  MutexLockGuard local_88;
  MutexLockGuard lock;
  BufferVector buffersToWrite;
  undefined1 local_58 [8];
  BufferPtr newBuffer;
  LogFile output;
  AsyncLogging *this_local;
  
  if ((this->running_ & 1U) != 1) {
    __assert_fail("running_ == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/AsyncLogging.cpp"
                  ,0x23,"void AsyncLogging::threadFunc()");
  }
  CountDownLatch::countDown(&this->latch_);
  LogFile::LogFile((LogFile *)
                   &newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,&this->basename_,0x400);
  this_00 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  FixedBuffer<4000000>::FixedBuffer(this_00);
  std::shared_ptr<FixedBuffer<4000000>>::shared_ptr<FixedBuffer<4000000>,void>
            ((shared_ptr<FixedBuffer<4000000>> *)local_58,this_00);
  peVar4 = std::__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_58);
  FixedBuffer<4000000>::bzero(peVar4,this_00,__n);
  std::
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ::vector((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            *)&lock);
  std::
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ::reserve((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             *)&lock,0x10);
  while( true ) {
    if ((this->running_ & 1U) == 0) {
      LogFile::flush((LogFile *)
                     &newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::~vector((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                 *)&lock);
      std::shared_ptr<FixedBuffer<4000000>_>::~shared_ptr
                ((shared_ptr<FixedBuffer<4000000>_> *)local_58);
      LogFile::~LogFile((LogFile *)
                        &newBuffer.
                         super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
      return;
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
    bVar2 = false;
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
      iVar3 = FixedBuffer<4000000>::length(peVar4);
      bVar2 = iVar3 == 0;
    }
    if (!bVar2) {
      __assert_fail("newBuffer && newBuffer->length() == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/AsyncLogging.cpp"
                    ,0x2c,"void AsyncLogging::threadFunc()");
    }
    bVar2 = std::
            vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            ::empty((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                     *)&lock);
    if (!bVar2) {
      __assert_fail("buffersToWrite.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/AsyncLogging.cpp"
                    ,0x2d,"void AsyncLogging::threadFunc()");
    }
    MutexLockGuard::MutexLockGuard(&local_88,&this->mutex_);
    bVar2 = std::
            vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            ::empty(&this->buffers_);
    if (bVar2) {
      Condition::waitForSeconds(&this->cond_,this->flushInterval_);
    }
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::push_back(&this->buffers_,&this->currentBuffer_);
    std::shared_ptr<FixedBuffer<4000000>_>::operator=
              (&this->currentBuffer_,(shared_ptr<FixedBuffer<4000000>_> *)local_58);
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::swap((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            *)&lock,&this->buffers_);
    MutexLockGuard::~MutexLockGuard(&local_88);
    bVar2 = std::
            vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            ::empty((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                     *)&lock);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    sVar5 = std::
            vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            ::size((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                    *)&lock);
    if (0x19 < sVar5) {
      local_a0._M_current =
           (shared_ptr<FixedBuffer<4000000>_> *)
           std::
           vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
           ::begin((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                    *)&lock);
      local_98 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<FixedBuffer<4000000>_>_*,_std::vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>_>
                 ::operator+(&local_a0,2);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<FixedBuffer<4000000>>const*,std::vector<std::shared_ptr<FixedBuffer<4000000>>,std::allocator<std::shared_ptr<FixedBuffer<4000000>>>>>
      ::__normal_iterator<std::shared_ptr<FixedBuffer<4000000>>*>
                ((__normal_iterator<std::shared_ptr<FixedBuffer<4000000>>const*,std::vector<std::shared_ptr<FixedBuffer<4000000>>,std::allocator<std::shared_ptr<FixedBuffer<4000000>>>>>
                  *)&local_90,&local_98);
      local_b0._M_current =
           (shared_ptr<FixedBuffer<4000000>_> *)
           std::
           vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
           ::end((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                  *)&lock);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<FixedBuffer<4000000>>const*,std::vector<std::shared_ptr<FixedBuffer<4000000>>,std::allocator<std::shared_ptr<FixedBuffer<4000000>>>>>
      ::__normal_iterator<std::shared_ptr<FixedBuffer<4000000>>*>
                ((__normal_iterator<std::shared_ptr<FixedBuffer<4000000>>const*,std::vector<std::shared_ptr<FixedBuffer<4000000>>,std::allocator<std::shared_ptr<FixedBuffer<4000000>>>>>
                  *)&local_a8,&local_b0);
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::erase((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               *)&lock,local_90,local_a8);
    }
    __end2 = std::
             vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ::begin((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                      *)&lock);
    buffer = (shared_ptr<FixedBuffer<4000000>_> *)
             std::
             vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ::end((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                    *)&lock);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<FixedBuffer<4000000>_>_*,_std::vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>_>
                                       *)&buffer), bVar2) {
      this_01 = (__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<FixedBuffer<4000000>_>_*,_std::vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>_>
                   ::operator*(&__end2);
      peVar4 = std::
               __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_01);
      logline = FixedBuffer<4000000>::data(peVar4);
      peVar4 = std::
               __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_01);
      iVar3 = FixedBuffer<4000000>::length(peVar4);
      LogFile::append((LogFile *)
                      &newBuffer.
                       super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,logline,iVar3);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<FixedBuffer<4000000>_>_*,_std::vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>_>
      ::operator++(&__end2);
    }
    sVar5 = std::
            vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            ::size((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                    *)&lock);
    if (1 < sVar5) {
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::resize((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                *)&lock,1);
    }
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
    if (!bVar2) {
      bVar2 = std::
              vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
              ::empty((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                       *)&lock);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!buffersToWrite.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/AsyncLogging.cpp"
                      ,0x47,"void AsyncLogging::threadFunc()");
      }
      __r = std::
            vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            ::back((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                    *)&lock);
      std::shared_ptr<FixedBuffer<4000000>_>::operator=
                ((shared_ptr<FixedBuffer<4000000>_> *)local_58,__r);
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::pop_back((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                  *)&lock);
      peVar4 = std::
               __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
      FixedBuffer<4000000>::reset(peVar4);
    }
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::clear((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             *)&lock);
    LogFile::flush((LogFile *)
                   &newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  }
  __assert_fail("!buffersToWrite.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/AsyncLogging.cpp"
                ,0x38,"void AsyncLogging::threadFunc()");
}

Assistant:

void AsyncLogging::threadFunc() {
    assert(running_ == true);
    latch_.countDown();
    LogFile output(basename_);
    BufferPtr newBuffer(new Buffer);
    newBuffer->bzero();
    BufferVector buffersToWrite;
    buffersToWrite.reserve(16);

    while (running_) {
        assert(newBuffer && newBuffer->length() == 0);
        assert(buffersToWrite.empty());
        {
            MutexLockGuard lock(mutex_);
            if(buffers_.empty()) {
                cond_.waitForSeconds(flushInterval_);
            }
            buffers_.push_back(std::move(currentBuffer_));
            currentBuffer_ = std::move(newBuffer);
            buffersToWrite.swap(buffers_);
        }
        
        assert(!buffersToWrite.empty());

        if (buffersToWrite.size() > 25) {
            buffersToWrite.erase(buffersToWrite.begin() + 2, buffersToWrite.end());
        }

        for (const auto& buffer : buffersToWrite) {
            output.append(buffer->data(), buffer->length());
        }

        if (buffersToWrite.size() > 1) {
            buffersToWrite.resize(1); 
        }

        if (!newBuffer) {
            assert(!buffersToWrite.empty());
            newBuffer = std::move(buffersToWrite.back());
            buffersToWrite.pop_back();
            newBuffer->reset();
        }

        buffersToWrite.clear();
        output.flush();
    }

    output.flush();
}